

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_Grp17.c
# Opt level: O1

void G17_(PDISASM pMyDisasm)

{
  ulong uVar1;
  uint uVar2;
  
  uVar1 = (pMyDisasm->Reserved_).EndOfBlock;
  if ((uVar1 != 0) && (uVar1 < (pMyDisasm->Reserved_).EIP_ + 2)) {
    (pMyDisasm->Reserved_).OutOfBlock = 1;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
    return;
  }
  uVar2 = *(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 3 & 7;
  (pMyDisasm->Reserved_).REGOPCODE = uVar2;
  if (uVar2 == 3) {
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      (pMyDisasm->Instruction).Category = 0x110003;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"blsi",4);
LAB_001373f6:
      (pMyDisasm->Instruction).Mnemonic[4] = '\0';
LAB_001373fa:
      if ((pMyDisasm->Reserved_).VEX.opcode == 0xc4) {
        if ((pMyDisasm->Reserved_).REX.W_ == '\x01') {
          (pMyDisasm->Reserved_).OperandSize = 0x40;
          (pMyDisasm->Reserved_).MemDecoration = 0x68;
        }
        else {
          (pMyDisasm->Reserved_).MemDecoration = 0x67;
        }
        fillRegister((uint)(pMyDisasm->Reserved_).EVEX.V << 4 |
                     ~(uint)(pMyDisasm->Reserved_).VEX.vvvv & 0xf,&pMyDisasm->Operand1,pMyDisasm);
        decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      }
      goto LAB_001374ae;
    }
  }
  else if (uVar2 == 2) {
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      (pMyDisasm->Instruction).Category = 0x110003;
      builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"blmsk",6);
      goto LAB_001373fa;
    }
  }
  else if ((uVar2 == 1) && ((pMyDisasm->Reserved_).VEX.state == '\x01')) {
    (pMyDisasm->Instruction).Category = 0x110003;
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"blsr",4);
    goto LAB_001373f6;
  }
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
  (pMyDisasm->Operand1).AccessMode = 0;
  (pMyDisasm->Operand2).AccessMode = 0;
  (pMyDisasm->Operand3).AccessMode = 0;
  (pMyDisasm->Operand4).AccessMode = 0;
  (pMyDisasm->Operand5).AccessMode = 0;
  (pMyDisasm->Operand6).AccessMode = 0;
  (pMyDisasm->Operand7).AccessMode = 0;
  (pMyDisasm->Operand8).AccessMode = 0;
  (pMyDisasm->Operand9).AccessMode = 0;
  (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
LAB_001374ae:
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  return;
}

Assistant:

void __bea_callspec__ G17_(PDISASM pMyDisasm)
{
  if (!Security(2, pMyDisasm)) return;
  GV.REGOPCODE = ((*((UInt8*) (GV.EIP_+1))) >> 3) & 0x7;
  if (GV.REGOPCODE == 1) {
    if (GV.VEX.state == InUsePrefix) {
      pMyDisasm->Instruction.Category = AVX_INSTRUCTION + LOGICAL_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "blsr");
      #endif
      if (GV.VEX.opcode == 0xc4) {
        /* using VEX3Bytes */
        if (GV.REX.W_ == 0x1) {
          GV.OperandSize = 64;
          GV.MemDecoration = Arg2qword;
          fillRegister((~GV.VEX.vvvv & 0xF) + 16 * GV.EVEX.V, &pMyDisasm->Operand1, pMyDisasm);
          decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        }
        else {
          GV.MemDecoration = Arg2dword;
          fillRegister((~GV.VEX.vvvv & 0xF) + 16 * GV.EVEX.V, &pMyDisasm->Operand1, pMyDisasm);
          decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        }
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else if (GV.REGOPCODE == 2) {
    if (GV.VEX.state == InUsePrefix) {
      pMyDisasm->Instruction.Category = AVX_INSTRUCTION + LOGICAL_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "blmsk");
      #endif
      if (GV.VEX.opcode == 0xc4) {
        /* using VEX3Bytes */
        if (GV.REX.W_ == 0x1) {
            GV.OperandSize = 64;
            GV.MemDecoration = Arg2qword;
            fillRegister((~GV.VEX.vvvv & 0xF) + 16 * GV.EVEX.V, &pMyDisasm->Operand1, pMyDisasm);
            decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        }
        else {
            GV.MemDecoration = Arg2dword;
            fillRegister((~GV.VEX.vvvv & 0xF) + 16 * GV.EVEX.V, &pMyDisasm->Operand1, pMyDisasm);
            decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        }
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else if (GV.REGOPCODE == 3) {
    if (GV.VEX.state == InUsePrefix) {
      pMyDisasm->Instruction.Category = AVX_INSTRUCTION + LOGICAL_INSTRUCTION;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy (pMyDisasm->Instruction.Mnemonic, "blsi");
      #endif
      if (GV.VEX.opcode == 0xc4) {
        /* using VEX3Bytes */
        if (GV.REX.W_ == 0x1) {
          GV.OperandSize = 64;
          GV.MemDecoration = Arg2qword;
          fillRegister((~GV.VEX.vvvv & 0xF) + 16 * GV.EVEX.V, &pMyDisasm->Operand1, pMyDisasm);
          decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        }
        else {
          GV.MemDecoration = Arg2dword;
          fillRegister((~GV.VEX.vvvv & 0xF) + 16 * GV.EVEX.V, &pMyDisasm->Operand1, pMyDisasm);
          decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        }
      }

    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
  GV.EIP_+= GV.DECALAGE_EIP + 2;
}